

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O1

ssize_t __thiscall
wasm::LEB<int,_signed_char>::write(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __n)

{
  iterator iVar1;
  ulong uVar2;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  uint uVar3;
  uint uVar4;
  byte local_29 [8];
  uint8_t byte;
  
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
            CONCAT44(in_register_00000034,__fd);
  uVar3 = this->value;
  while( true ) {
    uVar2 = (ulong)uVar3;
    local_29[0] = (byte)uVar3 & 0x7f;
    uVar4 = (int)uVar3 >> 7;
    if ((0xfffffffd < uVar4 - 1) && (((uVar3 & 0x40) == 0) == -1 < this->value)) break;
    local_29[0] = (byte)uVar3 | 0x80;
    iVar1._M_current = *(uchar **)(this_00 + 8);
    uVar3 = uVar4;
    if (iVar1._M_current == *(uchar **)(this_00 + 0x10)) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>(this_00,iVar1,local_29);
    }
    else {
      *iVar1._M_current = local_29[0];
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
    }
  }
  iVar1._M_current = *(uchar **)(this_00 + 8);
  if (iVar1._M_current == *(uchar **)(this_00 + 0x10)) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>(this_00,iVar1,local_29);
    uVar2 = extraout_RAX;
  }
  else {
    *iVar1._M_current = local_29[0];
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
  }
  return uVar2;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }